

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-log.c
# Opt level: O0

void borg_display_item(object *item2,wchar_t n)

{
  borg_item_conflict *item_00;
  char *pcVar1;
  borg_item *item;
  bitflag bStack_18;
  bitflag bStack_17;
  bitflag bStack_16;
  bitflag f [5];
  wchar_t j;
  wchar_t n_local;
  object *item2_local;
  
  bStack_18 = '\0';
  bStack_17 = '\0';
  bStack_16 = '\0';
  f[0] = '\0';
  item_00 = borg_items + n;
  f._1_4_ = n;
  object_flags(item2,(bitflag *)((long)&item + 3));
  Term_clear();
  prt(item_00->desc,L'\x02',_bStack_18);
  pcVar1 = format("kind = %-5lu  level = %-4d  tval = %-5d  sval = %-5d",(ulong)item_00->kind,
                  (ulong)item_00->level,(ulong)item_00->tval,(ulong)item_00->sval);
  prt(pcVar1,L'\x04',_bStack_18);
  pcVar1 = format("number = %-3d  wgt = %-6d  ac = %-5d    damage = %dd%d",(ulong)item_00->iqty,
                  (ulong)(uint)(int)item_00->weight,(ulong)(uint)(int)item_00->ac,(ulong)item_00->dd
                  ,(ulong)item_00->ds);
  prt(pcVar1,L'\x05',_bStack_18);
  pcVar1 = format("pval = %-5d  toac = %-5d  tohit = %-4d  todam = %-4d",
                  (ulong)(uint)(int)item_00->pval,(ulong)(uint)(int)item_00->to_a,
                  (ulong)(uint)(int)item_00->to_h,(ulong)(uint)(int)item_00->to_d);
  prt(pcVar1,L'\x06',_bStack_18);
  pcVar1 = format("name1 = %-4d  name2 = %-4d  value = %ld   cursed = %d   can uncurse = %d",
                  (ulong)item_00->art_idx,(ulong)item_00->ego_idx,(long)item_00->value,
                  (ulong)(item_00->cursed & 1),(ulong)(item_00->uncursable & 1));
  prt(pcVar1,L'\a',_bStack_18);
  pcVar1 = format("ident = %d      timeout = %-d",(ulong)(item_00->ident & 1),
                  (ulong)(uint)(int)item_00->timeout);
  prt(pcVar1,L'\b',_bStack_18);
  pcVar1 = borg_get_note(item_00);
  pcVar1 = format("Inscription: %s, chance: %d",pcVar1,
                  (ulong)(borg.trait[0x38] - (uint)item_00->level));
  prt(pcVar1,L'\t',_bStack_18);
  prt("+------------FLAGS1------------+",L'\n',_bStack_18);
  prt("AFFECT..........SLAY.......BRAND",L'\v',_bStack_18);
  prt("                ae      xxxpaefc",L'\f',_bStack_18);
  prt("siwdcc  ssidsasmnvudotgddduoclio",L'\r',_bStack_18);
  prt("tnieoh  trnipthgiinmrrnrrmniierl",L'\x0e',_bStack_18);
  prt("rtsxna..lcfgdkttmldncltggndsdced",L'\x0f',_bStack_18);
  if ((item_00->ident & 1U) != 0) {
    borg_prt_binary((uint)item._3_1_,L'\x10',_bStack_18);
  }
  prt("+------------FLAGS2------------+",L'\x11',_bStack_18);
  prt("SUST........IMM.RESIST.........",L'\x12',_bStack_18);
  prt("            afecaefcpfldbc s n  ",L'\x13',_bStack_18);
  prt("siwdcc      cilocliooeialoshnecd",L'\x14',_bStack_18);
  prt("tnieoh      irelierliatrnnnrethi",L'\x15',_bStack_18);
  prt("rtsxna......decddcedsrekdfddxhss",L'\x16',_bStack_18);
  if ((item_00->ident & 1U) != 0) {
    borg_prt_binary((uint)item._4_1_,L'\x17',_bStack_18);
  }
  prt("+------------FLAGS3------------+",L'\n',_bStack_18 + L' ');
  prt("s   ts h     tadiiii   aiehs  hp",L'\v',_bStack_18 + L' ');
  prt("lf  eefo     egrgggg  bcnaih  vr",L'\f',_bStack_18 + L' ');
  prt("we  lerln   ilgannnn  ltssdo  ym",L'\r',_bStack_18 + L' ');
  prt("da reiedo   merirrrr  eityew ccc",L'\x0e',_bStack_18 + L' ');
  prt("itlepnelf   ppanaefc  svaktm uuu",L'\x0f',_bStack_18 + L' ');
  prt("ghigavaiu   aoveclio  saanyo rrr",L'\x10',_bStack_18 + L' ');
  prt("seteticfe   craxierl  etropd sss",L'\x11',_bStack_18 + L' ');
  prt("trenhstel   tttpdced  detwes eee",L'\x12',_bStack_18 + L' ');
  if ((item_00->ident & 1U) != 0) {
    borg_prt_binary((uint)item._5_1_,L'\x13',_bStack_18 + L' ');
  }
  return;
}

Assistant:

void borg_display_item(struct object *item2, int n)
{
    int j = 0;

    bitflag f[OF_SIZE];

    borg_item *item;

    item = &borg_items[n];

    /* Extract the flags */
    object_flags(item2, f);

    /* Clear screen */
    Term_clear();

    /* Describe fully */
    prt(item->desc, 2, j);

    prt(format("kind = %-5lu  level = %-4d  tval = %-5d  sval = %-5d",
            (unsigned long)item->kind, item->level, item->tval, item->sval),
        4, j);

    prt(format("number = %-3d  wgt = %-6d  ac = %-5d    damage = %dd%d",
            item->iqty, item->weight, item->ac, item->dd, item->ds),
        5, j);

    prt(format("pval = %-5d  toac = %-5d  tohit = %-4d  todam = %-4d",
            item->pval, item->to_a, item->to_h, item->to_d),
        6, j);

    prt(format("name1 = %-4d  name2 = %-4d  value = %ld   cursed = %d   can "
               "uncurse = %d",
            item->art_idx, item->ego_idx, (long)item->value, item->cursed,
            item->uncursable),
        7, j);

    prt(format("ident = %d      timeout = %-d", item->ident, item->timeout), 8,
        j);

    /* maybe print the inscription */
    prt(format("Inscription: %s, chance: %d", borg_get_note(item),
            borg.trait[BI_DEV] - item->level),
        9, j);

    prt("+------------FLAGS1------------+", 10, j);
    prt("AFFECT..........SLAY.......BRAND", 11, j);
    prt("                ae      xxxpaefc", 12, j);
    prt("siwdcc  ssidsasmnvudotgddduoclio", 13, j);
    prt("tnieoh  trnipthgiinmrrnrrmniierl", 14, j);
    prt("rtsxna..lcfgdkttmldncltggndsdced", 15, j);
    if (item->ident)
        borg_prt_binary(f[0], 16, j);

    prt("+------------FLAGS2------------+", 17, j);
    prt("SUST........IMM.RESIST.........", 18, j);
    prt("            afecaefcpfldbc s n  ", 19, j);
    prt("siwdcc      cilocliooeialoshnecd", 20, j);
    prt("tnieoh      irelierliatrnnnrethi", 21, j);
    prt("rtsxna......decddcedsrekdfddxhss", 22, j);
    if (item->ident)
        borg_prt_binary(f[1], 23, j);

    prt("+------------FLAGS3------------+", 10, j + 32);
    prt("s   ts h     tadiiii   aiehs  hp", 11, j + 32);
    prt("lf  eefo     egrgggg  bcnaih  vr", 12, j + 32);
    prt("we  lerln   ilgannnn  ltssdo  ym", 13, j + 32);
    prt("da reiedo   merirrrr  eityew ccc", 14, j + 32);
    prt("itlepnelf   ppanaefc  svaktm uuu", 15, j + 32);
    prt("ghigavaiu   aoveclio  saanyo rrr", 16, j + 32);
    prt("seteticfe   craxierl  etropd sss", 17, j + 32);
    prt("trenhstel   tttpdced  detwes eee", 18, j + 32);
    if (item->ident)
        borg_prt_binary(f[2], 19, j + 32);
}